

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O2

int read_VDR(coda_cdf_product *product_file,int64_t offset,int is_zvar)

{
  coda_array_ordering array_ordering;
  long lVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [11];
  undefined1 auVar48 [15];
  undefined1 auVar49 [11];
  undefined1 auVar50 [15];
  undefined1 auVar51 [11];
  undefined1 auVar52 [15];
  undefined1 auVar53 [11];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  int iVar62;
  int iVar63;
  coda_dynamic_type *field_type;
  int32_t first;
  char *pcVar64;
  int32_t last;
  uint has_compression;
  bool bVar65;
  undefined1 auVar66 [16];
  ulong offset_00;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  uint local_214;
  int32_t *local_210;
  int local_208;
  int local_204;
  uint local_200;
  uint local_1fc;
  int local_1f8;
  int local_1f4;
  coda_cdf_variable *variable;
  int local_1e8;
  uint local_1e4;
  int local_1e0;
  int local_1dc;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  long local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  undefined1 local_17c [4];
  int32_t dim_varys [8];
  int32_t zdim_sizes [8];
  char name [257];
  int32_t *dim;
  
  if (offset == 0) {
    return 0;
  }
  iVar62 = read_bytes(product_file->raw_product,offset + 8,4,&local_1e0);
  if (iVar62 < 0) {
    return -1;
  }
  auVar66 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_1e0 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_1e0 >> 0x10),local_1e0
                                                          )) >> 0x20),local_1e0) >> 0x18),
                                      (char)((uint)local_1e0 >> 8)),(ushort)(byte)local_1e0) &
                    0xffffff00ffffff);
  auVar66 = pshuflw(auVar66,auVar66,0x1b);
  sVar6 = auVar66._0_2_;
  sVar7 = auVar66._2_2_;
  sVar8 = auVar66._4_2_;
  sVar9 = auVar66._6_2_;
  local_1e0 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar66[6] - (0xff < sVar9),
                       CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar66[4] - (0xff < sVar8),
                                CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar66[2] - (0xff < sVar7)
                                         ,(0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                          (0xff < sVar6))));
  if (is_zvar == 0) {
    if (local_1e0 == 3) goto LAB_0014f0ad;
    pcVar64 = "CDF file has invalid record type (%d) for rVDR record";
  }
  else {
    if (local_1e0 == 8) {
LAB_0014f0ad:
      iVar62 = read_bytes(product_file->raw_product,offset + 0xc,8,&local_1a0);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x14,4,&local_1f4);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x18,4,&local_1f8);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x1c,8,&local_1b8);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x24,8,&local_1c0);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x2c,4,&local_1fc);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x30,4,&local_208);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x40,4,&local_200);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x44,4,&local_204);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x48,8,&local_1c8);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x50,4,local_17c);
      if (iVar62 < 0) {
        return -1;
      }
      iVar62 = read_bytes(product_file->raw_product,offset + 0x54,0x100,name);
      if (iVar62 < 0) {
        return -1;
      }
      name[0x100] = '\0';
      rtrim(name);
      auVar14._8_6_ = 0;
      auVar14._0_8_ = local_1a0;
      auVar14[0xe] = (char)(local_1a0 >> 0x38);
      auVar18._8_4_ = 0;
      auVar18._0_8_ = local_1a0;
      auVar18[0xc] = (char)(local_1a0 >> 0x30);
      auVar18._13_2_ = auVar14._13_2_;
      auVar22._8_4_ = 0;
      auVar22._0_8_ = local_1a0;
      auVar22._12_3_ = auVar18._12_3_;
      auVar26._8_2_ = 0;
      auVar26._0_8_ = local_1a0;
      auVar26[10] = (char)(local_1a0 >> 0x28);
      auVar26._11_4_ = auVar22._11_4_;
      auVar30._8_2_ = 0;
      auVar30._0_8_ = local_1a0;
      auVar30._10_5_ = auVar26._10_5_;
      auVar34[8] = (char)(local_1a0 >> 0x20);
      auVar34._0_8_ = local_1a0;
      auVar34._9_6_ = auVar30._9_6_;
      auVar67[7] = 0;
      auVar67._0_7_ = auVar34._8_7_;
      auVar46._7_8_ = 0;
      auVar46._0_7_ = auVar34._8_7_;
      auVar54._1_8_ = SUB158(auVar46 << 0x40,7);
      auVar54[0] = (char)(local_1a0 >> 0x18);
      auVar54._9_6_ = 0;
      auVar47._1_10_ = SUB1510(auVar54 << 0x30,5);
      auVar47[0] = (char)(local_1a0 >> 0x10);
      auVar55._11_4_ = 0;
      auVar55._0_11_ = auVar47;
      auVar38[2] = (char)(local_1a0 >> 8);
      auVar38._0_2_ = (ushort)local_1a0;
      auVar38._3_12_ = SUB1512(auVar55 << 0x20,3);
      auVar42._2_13_ = auVar38._2_13_;
      auVar42._0_2_ = (ushort)local_1a0 & 0xff;
      auVar67._8_4_ = auVar42._0_4_;
      auVar67._12_4_ = auVar47._0_4_;
      auVar66 = pshuflw(auVar67,auVar67,0x1b);
      auVar66 = pshufhw(auVar66,auVar66,0x1b);
      sVar6 = auVar66._0_2_;
      sVar7 = auVar66._2_2_;
      sVar8 = auVar66._4_2_;
      sVar9 = auVar66._6_2_;
      sVar10 = auVar66._8_2_;
      sVar11 = auVar66._10_2_;
      sVar12 = auVar66._12_2_;
      sVar13 = auVar66._14_2_;
      cVar2 = (0 < sVar13) * (sVar13 < 0x100) * auVar66[0xe] - (0xff < sVar13);
      offset_00 = CONCAT17(cVar2,CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar66[0xc] -
                                          (0xff < sVar12),
                                          CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar66[10] -
                                                   (0xff < sVar11),
                                                   CONCAT14((0 < sVar10) * (sVar10 < 0x100) *
                                                            auVar66[8] - (0xff < sVar10),
                                                            CONCAT13((0 < sVar9) * (sVar9 < 0x100) *
                                                                     auVar66[6] - (0xff < sVar9),
                                                                     CONCAT12((0 < sVar8) *
                                                                              (sVar8 < 0x100) *
                                                                              auVar66[4] -
                                                                              (0xff < sVar8),
                                                                              CONCAT11((0 < sVar7) *
                                                                                       (sVar7 < 
                                                  0x100) * auVar66[2] - (0xff < sVar7),
                                                  (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                                  (0xff < sVar6))))))));
      auVar68._8_8_ = 0;
      auVar68._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_1f4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_1f4 >> 0x10),local_1f4
                                                          )) >> 0x20),local_1f4) >> 0x18),
                                           CONCAT12((char)((uint)local_1f4 >> 8),(short)local_1f4))
                                 >> 0x10),(short)local_1f4) & 0xffff00ff00ff00ff;
      auVar66 = pshuflw(auVar68,auVar68,0x1b);
      sVar6 = auVar66._0_2_;
      sVar7 = auVar66._2_2_;
      sVar8 = auVar66._4_2_;
      sVar9 = auVar66._6_2_;
      local_1f4 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar66[6] - (0xff < sVar9),
                           CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar66[4] - (0xff < sVar8),
                                    CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar66[2] -
                                             (0xff < sVar7),
                                             (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                             (0xff < sVar6))));
      auVar69._8_8_ = 0;
      auVar69._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_1f8 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_1f8 >> 0x10),local_1f8
                                                          )) >> 0x20),local_1f8) >> 0x18),
                                           CONCAT12((char)((uint)local_1f8 >> 8),(short)local_1f8))
                                 >> 0x10),(short)local_1f8) & 0xffff00ff00ff00ff;
      auVar66 = pshuflw(auVar69,auVar69,0x1b);
      sVar6 = auVar66._0_2_;
      sVar7 = auVar66._2_2_;
      sVar8 = auVar66._4_2_;
      sVar9 = auVar66._6_2_;
      local_1f8 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar66[6] - (0xff < sVar9),
                           CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar66[4] - (0xff < sVar8),
                                    CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar66[2] -
                                             (0xff < sVar7),
                                             (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                             (0xff < sVar6))));
      auVar15._8_6_ = 0;
      auVar15._0_8_ = local_1b8;
      auVar15[0xe] = (char)(local_1b8 >> 0x38);
      auVar19._8_4_ = 0;
      auVar19._0_8_ = local_1b8;
      auVar19[0xc] = (char)(local_1b8 >> 0x30);
      auVar19._13_2_ = auVar15._13_2_;
      auVar23._8_4_ = 0;
      auVar23._0_8_ = local_1b8;
      auVar23._12_3_ = auVar19._12_3_;
      auVar27._8_2_ = 0;
      auVar27._0_8_ = local_1b8;
      auVar27[10] = (char)(local_1b8 >> 0x28);
      auVar27._11_4_ = auVar23._11_4_;
      auVar31._8_2_ = 0;
      auVar31._0_8_ = local_1b8;
      auVar31._10_5_ = auVar27._10_5_;
      auVar35[8] = (char)(local_1b8 >> 0x20);
      auVar35._0_8_ = local_1b8;
      auVar35._9_6_ = auVar31._9_6_;
      auVar70[7] = 0;
      auVar70._0_7_ = auVar35._8_7_;
      auVar48._7_8_ = 0;
      auVar48._0_7_ = auVar35._8_7_;
      auVar56._1_8_ = SUB158(auVar48 << 0x40,7);
      auVar56[0] = (char)(local_1b8 >> 0x18);
      auVar56._9_6_ = 0;
      auVar49._1_10_ = SUB1510(auVar56 << 0x30,5);
      auVar49[0] = (char)(local_1b8 >> 0x10);
      auVar57._11_4_ = 0;
      auVar57._0_11_ = auVar49;
      auVar39[2] = (char)(local_1b8 >> 8);
      auVar39._0_2_ = (ushort)local_1b8;
      auVar39._3_12_ = SUB1512(auVar57 << 0x20,3);
      auVar43._2_13_ = auVar39._2_13_;
      auVar43._0_2_ = (ushort)local_1b8 & 0xff;
      auVar70._8_4_ = auVar43._0_4_;
      auVar70._12_4_ = auVar49._0_4_;
      auVar66 = pshuflw(auVar70,auVar70,0x1b);
      auVar66 = pshufhw(auVar66,auVar66,0x1b);
      sVar6 = auVar66._0_2_;
      sVar7 = auVar66._2_2_;
      sVar8 = auVar66._4_2_;
      sVar9 = auVar66._6_2_;
      sVar10 = auVar66._8_2_;
      sVar11 = auVar66._10_2_;
      sVar12 = auVar66._12_2_;
      sVar13 = auVar66._14_2_;
      cVar3 = (0 < sVar13) * (sVar13 < 0x100) * auVar66[0xe] - (0xff < sVar13);
      local_1b8 = CONCAT17(cVar3,CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar66[0xc] -
                                          (0xff < sVar12),
                                          CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar66[10] -
                                                   (0xff < sVar11),
                                                   CONCAT14((0 < sVar10) * (sVar10 < 0x100) *
                                                            auVar66[8] - (0xff < sVar10),
                                                            CONCAT13((0 < sVar9) * (sVar9 < 0x100) *
                                                                     auVar66[6] - (0xff < sVar9),
                                                                     CONCAT12((0 < sVar8) *
                                                                              (sVar8 < 0x100) *
                                                                              auVar66[4] -
                                                                              (0xff < sVar8),
                                                                              CONCAT11((0 < sVar7) *
                                                                                       (sVar7 < 
                                                  0x100) * auVar66[2] - (0xff < sVar7),
                                                  (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                                  (0xff < sVar6))))))));
      auVar16._8_6_ = 0;
      auVar16._0_8_ = local_1c0;
      auVar16[0xe] = (char)(local_1c0 >> 0x38);
      auVar20._8_4_ = 0;
      auVar20._0_8_ = local_1c0;
      auVar20[0xc] = (char)(local_1c0 >> 0x30);
      auVar20._13_2_ = auVar16._13_2_;
      auVar24._8_4_ = 0;
      auVar24._0_8_ = local_1c0;
      auVar24._12_3_ = auVar20._12_3_;
      auVar28._8_2_ = 0;
      auVar28._0_8_ = local_1c0;
      auVar28[10] = (char)(local_1c0 >> 0x28);
      auVar28._11_4_ = auVar24._11_4_;
      auVar32._8_2_ = 0;
      auVar32._0_8_ = local_1c0;
      auVar32._10_5_ = auVar28._10_5_;
      auVar36[8] = (char)(local_1c0 >> 0x20);
      auVar36._0_8_ = local_1c0;
      auVar36._9_6_ = auVar32._9_6_;
      auVar71[7] = 0;
      auVar71._0_7_ = auVar36._8_7_;
      auVar50._7_8_ = 0;
      auVar50._0_7_ = auVar36._8_7_;
      auVar58._1_8_ = SUB158(auVar50 << 0x40,7);
      auVar58[0] = (char)(local_1c0 >> 0x18);
      auVar58._9_6_ = 0;
      auVar51._1_10_ = SUB1510(auVar58 << 0x30,5);
      auVar51[0] = (char)(local_1c0 >> 0x10);
      auVar59._11_4_ = 0;
      auVar59._0_11_ = auVar51;
      auVar40[2] = (char)(local_1c0 >> 8);
      auVar40._0_2_ = (ushort)local_1c0;
      auVar40._3_12_ = SUB1512(auVar59 << 0x20,3);
      auVar44._2_13_ = auVar40._2_13_;
      auVar44._0_2_ = (ushort)local_1c0 & 0xff;
      auVar71._8_4_ = auVar44._0_4_;
      auVar71._12_4_ = auVar51._0_4_;
      auVar66 = pshuflw(auVar71,auVar71,0x1b);
      auVar66 = pshufhw(auVar66,auVar66,0x1b);
      sVar6 = auVar66._0_2_;
      sVar7 = auVar66._2_2_;
      sVar8 = auVar66._4_2_;
      sVar9 = auVar66._6_2_;
      sVar10 = auVar66._8_2_;
      sVar11 = auVar66._10_2_;
      sVar12 = auVar66._12_2_;
      sVar13 = auVar66._14_2_;
      cVar4 = (0 < sVar13) * (sVar13 < 0x100) * auVar66[0xe] - (0xff < sVar13);
      local_1c0 = CONCAT17(cVar4,CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar66[0xc] -
                                          (0xff < sVar12),
                                          CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar66[10] -
                                                   (0xff < sVar11),
                                                   CONCAT14((0 < sVar10) * (sVar10 < 0x100) *
                                                            auVar66[8] - (0xff < sVar10),
                                                            CONCAT13((0 < sVar9) * (sVar9 < 0x100) *
                                                                     auVar66[6] - (0xff < sVar9),
                                                                     CONCAT12((0 < sVar8) *
                                                                              (sVar8 < 0x100) *
                                                                              auVar66[4] -
                                                                              (0xff < sVar8),
                                                                              CONCAT11((0 < sVar7) *
                                                                                       (sVar7 < 
                                                  0x100) * auVar66[2] - (0xff < sVar7),
                                                  (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                                  (0xff < sVar6))))))));
      auVar72._8_8_ = 0;
      auVar72._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  local_1fc >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_1fc >> 0x10),local_1fc)) >>
                                                  0x20),local_1fc) >> 0x18),
                                           CONCAT12((char)(local_1fc >> 8),(short)local_1fc)) >>
                                 0x10),(short)local_1fc) & 0xffff00ff00ff00ff;
      auVar66 = pshuflw(auVar72,auVar72,0x1b);
      sVar6 = auVar66._0_2_;
      sVar7 = auVar66._2_2_;
      sVar8 = auVar66._4_2_;
      sVar9 = auVar66._6_2_;
      local_1fc = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar66[6] - (0xff < sVar9),
                           CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar66[4] - (0xff < sVar8),
                                    CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar66[2] -
                                             (0xff < sVar7),
                                             (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                             (0xff < sVar6))));
      auVar73._8_8_ = 0;
      auVar73._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_208 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_208 >> 0x10),local_208
                                                          )) >> 0x20),local_208) >> 0x18),
                                           CONCAT12((char)((uint)local_208 >> 8),(short)local_208))
                                 >> 0x10),(short)local_208) & 0xffff00ff00ff00ff;
      auVar66 = pshuflw(auVar73,auVar73,0x1b);
      sVar6 = auVar66._0_2_;
      sVar7 = auVar66._2_2_;
      sVar8 = auVar66._4_2_;
      sVar9 = auVar66._6_2_;
      local_208 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar66[6] - (0xff < sVar9),
                           CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar66[4] - (0xff < sVar8),
                                    CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar66[2] -
                                             (0xff < sVar7),
                                             (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                             (0xff < sVar6))));
      auVar74._8_8_ = 0;
      auVar74._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  local_200 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_200 >> 0x10),local_200)) >>
                                                  0x20),local_200) >> 0x18),
                                           CONCAT12((char)(local_200 >> 8),(short)local_200)) >>
                                 0x10),(short)local_200) & 0xffff00ff00ff00ff;
      auVar66 = pshuflw(auVar74,auVar74,0x1b);
      sVar6 = auVar66._0_2_;
      sVar7 = auVar66._2_2_;
      sVar8 = auVar66._4_2_;
      sVar9 = auVar66._6_2_;
      cVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar66[6] - (0xff < sVar9);
      local_200 = CONCAT13(cVar5,CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar66[4] -
                                          (0xff < sVar8),
                                          CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar66[2] -
                                                   (0xff < sVar7),
                                                   (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                                   (0xff < sVar6))));
      auVar75._8_8_ = 0;
      auVar75._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_204 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_204 >> 0x10),local_204
                                                          )) >> 0x20),local_204) >> 0x18),
                                           CONCAT12((char)((uint)local_204 >> 8),(short)local_204))
                                 >> 0x10),(short)local_204) & 0xffff00ff00ff00ff;
      auVar66 = pshuflw(auVar75,auVar75,0x1b);
      sVar6 = auVar66._0_2_;
      sVar7 = auVar66._2_2_;
      sVar8 = auVar66._4_2_;
      sVar9 = auVar66._6_2_;
      local_204 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar66[6] - (0xff < sVar9),
                           CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar66[4] - (0xff < sVar8),
                                    CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar66[2] -
                                             (0xff < sVar7),
                                             (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                             (0xff < sVar6))));
      auVar17._8_6_ = 0;
      auVar17._0_8_ = local_1c8;
      auVar17[0xe] = (char)(local_1c8 >> 0x38);
      auVar21._8_4_ = 0;
      auVar21._0_8_ = local_1c8;
      auVar21[0xc] = (char)(local_1c8 >> 0x30);
      auVar21._13_2_ = auVar17._13_2_;
      auVar25._8_4_ = 0;
      auVar25._0_8_ = local_1c8;
      auVar25._12_3_ = auVar21._12_3_;
      auVar29._8_2_ = 0;
      auVar29._0_8_ = local_1c8;
      auVar29[10] = (char)(local_1c8 >> 0x28);
      auVar29._11_4_ = auVar25._11_4_;
      auVar33._8_2_ = 0;
      auVar33._0_8_ = local_1c8;
      auVar33._10_5_ = auVar29._10_5_;
      auVar37[8] = (char)(local_1c8 >> 0x20);
      auVar37._0_8_ = local_1c8;
      auVar37._9_6_ = auVar33._9_6_;
      auVar66[7] = 0;
      auVar66._0_7_ = auVar37._8_7_;
      auVar52._7_8_ = 0;
      auVar52._0_7_ = auVar37._8_7_;
      auVar60._1_8_ = SUB158(auVar52 << 0x40,7);
      auVar60[0] = (char)(local_1c8 >> 0x18);
      auVar60._9_6_ = 0;
      auVar53._1_10_ = SUB1510(auVar60 << 0x30,5);
      auVar53[0] = (char)(local_1c8 >> 0x10);
      auVar61._11_4_ = 0;
      auVar61._0_11_ = auVar53;
      auVar41[2] = (char)(local_1c8 >> 8);
      auVar41._0_2_ = (ushort)local_1c8;
      auVar41._3_12_ = SUB1512(auVar61 << 0x20,3);
      auVar45._2_13_ = auVar41._2_13_;
      auVar45._0_2_ = (ushort)local_1c8 & 0xff;
      auVar66._8_4_ = auVar45._0_4_;
      auVar66._12_4_ = auVar53._0_4_;
      auVar66 = pshuflw(auVar66,auVar66,0x1b);
      auVar66 = pshufhw(auVar66,auVar66,0x1b);
      sVar6 = auVar66._0_2_;
      sVar7 = auVar66._2_2_;
      sVar8 = auVar66._4_2_;
      sVar9 = auVar66._6_2_;
      sVar10 = auVar66._8_2_;
      sVar11 = auVar66._10_2_;
      sVar12 = auVar66._12_2_;
      sVar13 = auVar66._14_2_;
      local_1c8 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar66[0xe] - (0xff < sVar13),
                           CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar66[0xc] - (0xff < sVar12)
                                    ,CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar66[10] -
                                              (0xff < sVar11),
                                              CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar66[8]
                                                       - (0xff < sVar10),
                                                       CONCAT13((0 < sVar9) * (sVar9 < 0x100) *
                                                                auVar66[6] - (0xff < sVar9),
                                                                CONCAT12((0 < sVar8) *
                                                                         (sVar8 < 0x100) *
                                                                         auVar66[4] - (0xff < sVar8)
                                                                         ,CONCAT11((0 < sVar7) *
                                                                                   (sVar7 < 0x100) *
                                                                                   auVar66[2] -
                                                                                   (0xff < sVar7),
                                                                                   (0 < sVar6) *
                                                                                   (sVar6 < 0x100) *
                                                                                   auVar66[0] -
                                                                                   (0xff < sVar6))))
                                                      ))));
      local_1a0 = offset_00;
      if ((cVar2 < '\0') || (lVar1 = product_file->file_size, lVar1 <= (long)offset_00)) {
        pcVar64 = "CDF file has invalid offset for VDR record";
      }
      else if ((cVar3 < '\0' || lVar1 <= (long)local_1b8) ||
              (local_188 = local_1b8, cVar4 < '\0' || lVar1 <= (long)local_1c0)) {
        pcVar64 = "CDF file has invalid offset for VXR record";
      }
      else {
        local_1a8 = (ulong)local_200;
        if (cVar5 < '\0') {
          pcVar64 = "CDF file has invalid number of elements in VDR record";
        }
        else {
          local_1b0 = (long)local_204;
          if (local_1b0 < 0) {
            pcVar64 = "CDF file has invalid variable number in VDR record";
          }
          else {
            local_1d8 = local_1c8;
            if (-2 < (long)local_1c8 && (long)local_1c8 < lVar1) {
              if (local_1f4 == 0x20) {
                pcVar64 = "CDF EPOCH16 data type is not supported";
                iVar62 = -200;
                local_1e8 = 0x20;
                goto LAB_0014f436;
              }
              local_1e8 = local_1f4;
              if (is_zvar == 0) {
                local_214 = product_file->rnum_dims;
LAB_0014f4c3:
                if (0 < (int)local_214) {
                  local_1d0 = (ulong)local_214;
                  local_210 = dim_varys;
                  while (bVar65 = local_1d0 != 0, local_1d0 = local_1d0 - 1, bVar65) {
                    iVar62 = read_bytes(product_file->raw_product,offset,4,local_210);
                    if (iVar62 < 0) {
                      return -1;
                    }
                    swap4(local_210);
                    local_210 = local_210 + 1;
                    offset = offset + 4;
                  }
                }
              }
              else {
                iVar62 = read_bytes(product_file->raw_product,offset + 0x154,4,&local_1e4);
                if (iVar62 < 0) {
                  return -1;
                }
                auVar66 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(
                                                  byte)(local_1e4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_1e4 >> 0x10),local_1e4)) >>
                                                  0x20),local_1e4) >> 0x18),(char)(local_1e4 >> 8)),
                                           (ushort)(byte)local_1e4) & 0xffffff00ffffff);
                auVar66 = pshuflw(auVar66,auVar66,0x1b);
                sVar6 = auVar66._0_2_;
                sVar7 = auVar66._2_2_;
                sVar8 = auVar66._4_2_;
                sVar9 = auVar66._6_2_;
                cVar2 = (0 < sVar9) * (sVar9 < 0x100) * auVar66[6] - (0xff < sVar9);
                local_214 = CONCAT13(cVar2,CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar66[4] -
                                                    (0xff < sVar8),
                                                    CONCAT11((0 < sVar7) * (sVar7 < 0x100) *
                                                             auVar66[2] - (0xff < sVar7),
                                                             (0 < sVar6) * (sVar6 < 0x100) *
                                                             auVar66[0] - (0xff < sVar6))));
                local_1e4 = local_214;
                if (cVar2 < '\0') {
                  pcVar64 = "CDF variable \'%s\' has invalid number of dimensions (%d)";
                  goto LAB_0014f60b;
                }
                if (8 < local_214) {
                  pcVar64 = "CDF variable \'%s\' has too many dimensions (%d)";
                  goto LAB_0014f60b;
                }
                if (local_214 != 0) {
                  local_198 = (ulong)local_214;
                  local_210 = zdim_sizes;
                  local_1d0 = offset + 0x158U;
                  local_190 = local_198;
                  while (bVar65 = local_190 != 0, local_190 = local_190 - 1, bVar65) {
                    iVar62 = read_bytes(product_file->raw_product,local_1d0,4,local_210);
                    if (iVar62 < 0) {
                      return -1;
                    }
                    swap4(local_210);
                    local_210 = local_210 + 1;
                    local_1d0 = local_1d0 + 4;
                  }
                  offset = offset + 0x158U + local_198 * 4;
                  goto LAB_0014f4c3;
                }
                local_214 = 0;
              }
              iVar62 = local_1f8;
              local_210._0_4_ = local_1fc & 1;
              if (local_1f8 != 0 && (local_1fc & 1) == 0) {
                local_214 = local_1f8 + 1;
                pcVar64 = 
                "CDF variable \'%s\' has non-varying record dimension but number of records (%d) is not equal to 1"
                ;
LAB_0014f60b:
                coda_set_error(-300,pcVar64,name,(ulong)local_214);
                return -1;
              }
              has_compression = local_1fc & 4;
              if ((local_1d8 == 0xffffffffffffffff || has_compression == 0) || (local_1d8 == 0)) {
LAB_0014f6d3:
                if (product_file->root_type->num_fields != local_1b0) {
                  coda_set_error(-300,"CDF variable has invalid number \'%d\', expected \'%ld\'",
                                 local_1b0);
                  return -1;
                }
                if (is_zvar == 0) {
                  dim = product_file->rdim_sizes;
                  array_ordering = product_file->array_ordering;
                }
                else {
                  array_ordering = product_file->array_ordering;
                  dim = zdim_sizes;
                }
                field_type = coda_cdf_variable_new
                                       (local_1e8,iVar62,(uint)local_210,local_214,dim,dim_varys,
                                        array_ordering,(int32_t)local_1a8,local_208,has_compression,
                                        &variable);
                last = (int32_t)dim;
                if (field_type == (coda_dynamic_type *)0x0) {
                  return -1;
                }
                first = 1;
                iVar62 = coda_mem_record_add_field(product_file->root_type,name,field_type,1);
                if (iVar62 != 0) {
                  coda_cdf_type_delete(field_type);
                  return -1;
                }
                iVar62 = read_VXR(product_file,
                                  (coda_cdf_variable *)CONCAT44(variable._4_4_,(int)variable),
                                  local_188,first,last);
                if (iVar62 != 0) {
                  return -1;
                }
                iVar62 = read_VDR(product_file,offset_00,is_zvar);
                return -(uint)(iVar62 != 0);
              }
              iVar63 = read_bytes(product_file->raw_product,local_1d8 + 8,4,&variable);
              if (iVar63 < 0) {
                return -1;
              }
              auVar66 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(
                                                  byte)((uint)(int)variable >> 0x18) << 0x30) >>
                                                  0x28),CONCAT14((char)((uint)(int)variable >> 0x10)
                                                                 ,(int)variable)) >> 0x20),
                                                  (int)variable) >> 0x18),
                                                  (char)((uint)(int)variable >> 8)),
                                         (ushort)(byte)(int)variable) & 0xffffff00ffffff);
              auVar66 = pshuflw(auVar66,auVar66,0x1b);
              sVar6 = auVar66._0_2_;
              sVar7 = auVar66._2_2_;
              sVar8 = auVar66._4_2_;
              sVar9 = auVar66._6_2_;
              variable._0_4_ =
                   CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar66[6] - (0xff < sVar9),
                            CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar66[4] - (0xff < sVar8),
                                     CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar66[2] -
                                              (0xff < sVar7),
                                              (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                              (0xff < sVar6))));
              if ((int)variable == 0xb) {
                iVar63 = read_bytes(product_file->raw_product,local_1d8 + 0xc,4,&local_1dc);
                if (iVar63 < 0) {
                  return -1;
                }
                auVar66 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(
                                                  byte)((uint)local_1dc >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_1dc >> 0x10),local_1dc
                                                          )) >> 0x20),local_1dc) >> 0x18),
                                                  (char)((uint)local_1dc >> 8)),
                                           (ushort)(byte)local_1dc) & 0xffffff00ffffff);
                auVar66 = pshuflw(auVar66,auVar66,0x1b);
                sVar6 = auVar66._0_2_;
                sVar7 = auVar66._2_2_;
                sVar8 = auVar66._4_2_;
                sVar9 = auVar66._6_2_;
                local_1dc = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar66[6] - (0xff < sVar9),
                                     CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar66[4] -
                                              (0xff < sVar8),
                                              CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar66[2] -
                                                       (0xff < sVar7),
                                                       (0 < sVar6) * (sVar6 < 0x100) * auVar66[0] -
                                                       (0xff < sVar6))));
                if (local_1dc == 5) goto LAB_0014f6d3;
                pcVar64 = "Unsupported compression method (%d) for CDF variable";
                iVar62 = -200;
                goto LAB_0014f406;
              }
              pcVar64 = "CDF file has invalid record type (%d) for CPR record";
              goto LAB_0014f401;
            }
            pcVar64 = "CDF file has invalid offset for CPR/SPR record";
          }
        }
      }
      iVar62 = -300;
LAB_0014f436:
      coda_set_error(iVar62,pcVar64);
      return -1;
    }
    pcVar64 = "CDF file has invalid record type (%d) for zVDR record";
  }
LAB_0014f401:
  iVar62 = -300;
LAB_0014f406:
  coda_set_error(iVar62,pcVar64);
  return -1;
}

Assistant:

static int read_VDR(coda_cdf_product *product_file, int64_t offset, int is_zvar)
{
    coda_dynamic_type *variable_type;
    coda_cdf_variable *variable;
    int32_t record_type;
    int64_t vdr_next;
    int32_t data_type;
    int32_t max_rec;
    int64_t vxr_head;
    int64_t vxr_tail;
    int32_t flags;
    int32_t srecords;
    int32_t num_elems;
    int32_t num;
    int64_t cpr_spr_offset;
    int32_t blocking_factor;
    char name[257];
    int32_t num_dims;
    int32_t zdim_sizes[CODA_MAX_NUM_DIMS];
    int32_t dim_varys[CODA_MAX_NUM_DIMS];
    int record_varys;
    int has_compression;
    int i;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (is_zvar)
    {
        if (record_type != 8)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for zVDR record", record_type);
            return -1;
        }
    }
    else
    {
        if (record_type != 3)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for rVDR record", record_type);
            return -1;
        }
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &vdr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &data_type) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &max_rec) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 8, &vxr_head) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 36, 8, &vxr_tail) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 44, 4, &flags) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 48, 4, &srecords) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 64, 4, &num_elems) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 68, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 72, 8, &cpr_spr_offset) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 80, 4, &blocking_factor) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 84, 256, name) < 0)
    {
        return -1;
    }
    name[256] = '\0';
    rtrim(name);
#ifndef WORDS_BIGENDIAN
    swap_int64(&vdr_next);
    swap_int32(&data_type);
    swap_int32(&max_rec);
    swap_int64(&vxr_head);
    swap_int64(&vxr_tail);
    swap_int32(&flags);
    swap_int32(&srecords);
    swap_int32(&num_elems);
    swap_int32(&num);
    swap_int64(&cpr_spr_offset);
    swap_int32(&blocking_factor);
#endif
    if (vdr_next < 0 || vdr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VDR record");
        return -1;
    }
    if (vxr_head < 0 || vxr_head >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (vxr_tail < 0 || vxr_tail >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (num_elems < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of elements in VDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid variable number in VDR record");
        return -1;
    }
    if (cpr_spr_offset < -1 || cpr_spr_offset >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for CPR/SPR record");
        return -1;
    }

    if (data_type == 32)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF EPOCH16 data type is not supported");
        return -1;
    }
    if (is_zvar)
    {
        if (read_bytes(product_file->raw_product, offset + 340, 4, &num_dims) < 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&num_dims);
#endif
        if (num_dims < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has invalid number of dimensions (%d)", name,
                           num_dims);
            return -1;
        }
        if (num_dims > CODA_MAX_NUM_DIMS)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has too many dimensions (%d)", name, num_dims);
            return -1;
        }
        offset += 344;
        if (num_dims > 0)
        {
            for (i = 0; i < num_dims; i++)
            {
                if (read_bytes(product_file->raw_product, offset + i * 4, 4, &zdim_sizes[i]) < 0)
                {
                    return -1;
                }
#ifndef WORDS_BIGENDIAN
                swap_int32(&zdim_sizes[i]);
#endif
            }
            offset += num_dims * 4;
        }
    }
    else
    {
        num_dims = product_file->rnum_dims;
    }

    if (num_dims > 0)
    {
        for (i = 0; i < num_dims; i++)
        {
            if (read_bytes(product_file->raw_product, offset + i * 4, 4, &dim_varys[i]) < 0)
            {
                return -1;
            }
#ifndef WORDS_BIGENDIAN
            swap_int32(&dim_varys[i]);
#endif
        }
        offset += num_dims * 4;
    }
    record_varys = flags & 1;
    /* int has_pad_value = flags & 2; */
    has_compression = flags & 4;
    /* int64_t pad_value_offset = offset; */
    if (!record_varys && max_rec != 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has non-varying record dimension but number of records "
                       "(%d) is not equal to 1", name, max_rec + 1);
        return -1;
    }

    if (has_compression && cpr_spr_offset != -1)
    {
        if (read_CPR(product_file, cpr_spr_offset) != 0)
        {
            return -1;
        }
    }
    if (product_file->root_type->num_fields != num)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF variable has invalid number '%d', expected '%ld'", num,
                       product_file->root_type->num_fields);
        return -1;
    }

    if (is_zvar)
    {
        variable_type = coda_cdf_variable_new(data_type, max_rec, record_varys, num_dims, zdim_sizes, dim_varys,
                                              product_file->array_ordering, num_elems, srecords, has_compression,
                                              &variable);
    }
    else
    {
        variable_type = coda_cdf_variable_new(data_type, max_rec, record_varys, num_dims, product_file->rdim_sizes,
                                              dim_varys, product_file->array_ordering, num_elems, srecords,
                                              has_compression, &variable);
    }
    if (variable_type == NULL)
    {
        return -1;
    }
    if (coda_mem_record_add_field(product_file->root_type, name, variable_type, 1) != 0)
    {
        coda_cdf_type_delete((coda_dynamic_type *)variable_type);
        return -1;
    }

    if (read_VXR(product_file, variable, vxr_head, 0, -1) != 0)
    {
        return -1;
    }

    if (read_VDR(product_file, vdr_next, is_zvar) != 0)
    {
        return -1;
    }

    return 0;
}